

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O0

void __thiscall tonk::UDPSocket::CloseSocket(UDPSocket *this)

{
  bool bVar1;
  basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *this_00;
  OutputWorker *in_RDI;
  error_code error;
  LogStringBuffer buffer;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  LogStringBuffer *in_stack_fffffffffffffca0;
  error_code *in_stack_fffffffffffffcb8;
  LogStringBuffer *pLVar2;
  LogStringBuffer *buffer_00;
  string local_308 [32];
  int local_2e8;
  error_code local_2d8;
  string *local_2c0;
  char *local_2b8;
  LogStringBuffer *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  LogStringBuffer *local_290;
  undefined4 local_284;
  LogStringBuffer *local_280;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  string *local_e0;
  char *local_d8;
  undefined4 local_cc;
  LogStringBuffer *local_c8;
  string *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  LogStringBuffer *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  LogStringBuffer *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  string *local_70;
  char *local_68;
  undefined1 *local_60;
  LogStringBuffer *local_58;
  string *local_50;
  undefined1 *local_48;
  LogStringBuffer *local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  LogStringBuffer *local_18;
  char *local_10;
  undefined1 *local_8;
  
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_fffffffffffffca0,(bool)in_stack_fffffffffffffc9f);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                      *)0x1f94fe);
  if (bVar1) {
    std::error_code::error_code((error_code *)in_stack_fffffffffffffca0);
    this_00 = &std::
               unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
               ::operator->((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                             *)0x1f9525)->
               super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>;
    local_2e8 = asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::
                close(this_00,(int)&local_2d8);
    bVar1 = std::error_code::operator_cast_to_bool(&local_2d8);
    if (bVar1) {
      pLVar2 = (LogStringBuffer *)
               (in_RDI->QueuePublic).
               super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
               ._M_impl._M_node._M_size;
      std::error_code::message_abi_cxx11_(in_stack_fffffffffffffcb8);
      local_2b8 = "Failure while destroying UDP socket: ";
      local_2c0 = local_308;
      local_294 = 3;
      local_2a0 = "Failure while destroying UDP socket: ";
      local_284 = 3;
      local_2b0 = pLVar2;
      local_2a8 = local_2c0;
      local_290 = pLVar2;
      local_280 = pLVar2;
      if ((int)pLVar2->LogLevel < 4) {
        local_cc = 3;
        local_d8 = "Failure while destroying UDP socket: ";
        buffer_00 = pLVar2;
        local_e0 = local_2c0;
        local_c8 = pLVar2;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffffca0,
                   (char *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),Trace);
        local_b0 = &pLVar2->field_0x38;
        local_a8 = local_268;
        local_b8 = local_d8;
        local_c0 = local_e0;
        local_a0 = pLVar2;
        local_98 = local_b0;
        local_90 = local_a8;
        local_88 = pLVar2;
        local_80 = local_b0;
        local_78 = local_a8;
        std::operator<<(aoStack_258,(string *)local_b0);
        local_60 = local_a8;
        local_68 = local_b8;
        local_70 = local_c0;
        local_20 = local_a8;
        local_28 = local_b8;
        local_8 = local_a8;
        local_10 = local_b8;
        local_58 = pLVar2;
        local_18 = pLVar2;
        std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
        local_48 = local_60;
        local_50 = local_70;
        local_30 = local_60;
        local_38 = local_70;
        local_40 = pLVar2;
        std::operator<<((ostream *)(local_60 + 0x10),local_70);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_RDI,buffer_00);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1f98be);
      }
      std::__cxx11::string::~string(local_308);
    }
  }
  return;
}

Assistant:

void UDPSocket::CloseSocket()
{
    SocketClosed = true;

    if (Socket)
    {
        asio::error_code error;
        Socket->close(error);

        if (error) {
            Deps.Logger->Warning("Failure while destroying UDP socket: ", error.message());
        }
    }
}